

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::AddSharedDepItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  SharedDepMode SVar1;
  cmGeneratorTarget *this_00;
  cmOrderDirectories *this_01;
  bool bVar2;
  TargetType TVar3;
  long lVar4;
  string lib;
  string soName;
  string local_70;
  string local_50;
  
  this_00 = entry->Target;
  if (this_00 == (cmGeneratorTarget *)0x0) {
    if (this->SharedDependencyMode == SharedDepModeNone) {
      return;
    }
    bVar2 = cmsys::SystemTools::FileIsFullPath((string *)entry);
    if (!bVar2) {
      return;
    }
    cmsys::SystemTools::GetFilenameName(&local_70,(string *)entry);
    bVar2 = cmsys::RegularExpression::find
                      (&this->ExtractSharedLibraryName,local_70._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_70);
    if (!bVar2) {
      return;
    }
  }
  else {
    TVar3 = cmGeneratorTarget::GetType(this_00);
    if (((TVar3 == SHARED_LIBRARY) &&
        (bVar2 = cmGeneratorTarget::IsDLLPlatform(this->Target), bVar2)) &&
       (this->SharedDependencyMode != SharedDepModeLink)) {
      AddRuntimeDLL(this,this_00);
    }
    if (this->SharedDependencyMode == SharedDepModeNone) {
      return;
    }
    TVar3 = cmGeneratorTarget::GetType(this_00);
    if (TVar3 != SHARED_LIBRARY) {
      return;
    }
  }
  if (this->SharedDependencyMode == SharedDepModeLink) {
    AddItem(this,entry);
    return;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  if (this_00 == (cmGeneratorTarget *)0x0) {
    std::__cxx11::string::_M_assign((string *)&local_70);
    AddLibraryRuntimeInfo(this,&local_70);
  }
  else {
    bVar2 = cmGeneratorTarget::HasImportLibrary(this_00,&this->Config);
    cmGeneratorTarget::GetFullPath(&local_50,this_00,&this->Config,(uint)bVar2,false);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    AddLibraryRuntimeInfo(this,&local_70,this_00);
  }
  SVar1 = this->SharedDependencyMode;
  if (SVar1 == SharedDepModeDir) {
    lVar4 = 0x6c0;
  }
  else if ((SVar1 != SharedDepModeLibDir) || (lVar4 = 0x5b0, this->LinkWithRuntimePath != false))
  goto LAB_002f0879;
  this_01 = *(cmOrderDirectories **)
             ((long)&(this->Items).
                     super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar4);
  if (this_01 != (cmOrderDirectories *)0x0) {
    if (this_00 == (cmGeneratorTarget *)0x0) {
      cmOrderDirectories::AddRuntimeLibrary(this_01,&local_70,(char *)0x0);
    }
    else {
      cmGeneratorTarget::GetSOName(&local_50,this_00,&this->Config);
      if ((char *)local_50._M_string_length != (char *)0x0) {
        local_50._M_string_length = (size_type)local_50._M_dataplus._M_p;
      }
      cmOrderDirectories::AddRuntimeLibrary(this_01,&local_70,(char *)local_50._M_string_length);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
LAB_002f0879:
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void cmComputeLinkInformation::AddSharedDepItem(LinkEntry const& entry)
{
  BT<std::string> const& item = entry.Item;
  const cmGeneratorTarget* tgt = entry.Target;

  // Record dependencies on DLLs.
  if (tgt && tgt->GetType() == cmStateEnums::SHARED_LIBRARY &&
      this->Target->IsDLLPlatform() &&
      this->SharedDependencyMode != SharedDepModeLink) {
    this->AddRuntimeDLL(tgt);
  }

  // If dropping shared library dependencies, ignore them.
  if (this->SharedDependencyMode == SharedDepModeNone) {
    return;
  }

  // The user may have incorrectly named an item.  Skip items that are
  // not full paths to shared libraries.
  if (tgt) {
    // The target will provide a full path.  Make sure it is a shared
    // library.
    if (tgt->GetType() != cmStateEnums::SHARED_LIBRARY) {
      return;
    }
  } else {
    // Skip items that are not full paths.  We will not be able to
    // reliably specify them.
    if (!cmSystemTools::FileIsFullPath(item.Value)) {
      return;
    }

    // Get the name of the library from the file name.
    std::string file = cmSystemTools::GetFilenameName(item.Value);
    if (!this->ExtractSharedLibraryName.find(file)) {
      // This is not the name of a shared library.
      return;
    }
  }

  // If in linking mode, just link to the shared library.
  if (this->SharedDependencyMode == SharedDepModeLink) {
    this->AddItem(entry);
    return;
  }

  // Get a full path to the dependent shared library.
  // Add it to the runtime path computation so that the target being
  // linked will be able to find it.
  std::string lib;
  if (tgt) {
    cmStateEnums::ArtifactType artifact = tgt->HasImportLibrary(this->Config)
      ? cmStateEnums::ImportLibraryArtifact
      : cmStateEnums::RuntimeBinaryArtifact;
    lib = tgt->GetFullPath(this->Config, artifact);
    this->AddLibraryRuntimeInfo(lib, tgt);
  } else {
    lib = item.Value;
    this->AddLibraryRuntimeInfo(lib);
  }

  // Check if we need to include the dependent shared library in other
  // path ordering.
  cmOrderDirectories* order = nullptr;
  if (this->SharedDependencyMode == SharedDepModeLibDir &&
      !this->LinkWithRuntimePath /* AddLibraryRuntimeInfo adds it */) {
    // Add the item to the linker search path.
    order = this->OrderLinkerSearchPath.get();
  } else if (this->SharedDependencyMode == SharedDepModeDir) {
    // Add the item to the separate dependent library search path.
    order = this->OrderDependentRPath.get();
  }
  if (order) {
    if (tgt) {
      std::string soName = tgt->GetSOName(this->Config);
      const char* soname = soName.empty() ? nullptr : soName.c_str();
      order->AddRuntimeLibrary(lib, soname);
    } else {
      order->AddRuntimeLibrary(lib);
    }
  }
}